

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O3

bool __thiscall cs::compiler_type::is_left_associative(compiler_type *this,token_base *ptr)

{
  undefined1 auVar1 [16];
  int iVar2;
  compile_error *pcVar3;
  iterator iVar4;
  string local_38;
  
  if (ptr == (token_base *)0x0) {
    pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Get the level of null token.","");
    compile_error::compile_error(pcVar3,&local_38);
    __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  iVar2 = (*ptr->_vptr_token_base[2])(ptr);
  if (iVar2 == 3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)&ptr[1]._vptr_token_base;
    local_38._M_dataplus._M_p._0_4_ = *(int *)&ptr[1]._vptr_token_base;
    iVar4 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
            ::find<cs::signal_types>
                      ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
                        *)&signal_left_associative,(key_arg<cs::signal_types> *)&local_38,
                       SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                       SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
    return iVar4.ctrl_ != (ctrl_t *)(signal_left_associative + DAT_00265b28);
  }
  pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Get the level of non-signal token.","");
  compile_error::compile_error(pcVar3,&local_38);
  __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

bool is_left_associative(token_base *ptr)
		{
			if (ptr == nullptr)
				throw compile_error("Get the level of null token.");
			if (ptr->get_type() != token_types::signal)
				throw compile_error("Get the level of non-signal token.");
			return signal_left_associative.count(static_cast<token_signal *>(ptr)->get_signal()) > 0;
		}